

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pelelm_prob.cpp
# Opt level: O2

void amrex_probinit(int *param_1,int *param_2,int *param_3,amrex_real *param_4,amrex_real *param_5)

{
  ParmParse pp;
  allocator local_81;
  string local_80;
  ParmParse local_60;
  
  std::__cxx11::string::string((string *)&local_80,"prob",&local_81);
  amrex::ParmParse::ParmParse(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  amrex::ParmParse::query(&local_60,"P_mean",&PeleLM::prob_parm->P_mean,0);
  amrex::ParmParse::query(&local_60,"standoff",&PeleLM::prob_parm->standoff,0);
  amrex::ParmParse::query(&local_60,"pertmag",&PeleLM::prob_parm->pertmag,0);
  pele::physics::PMF::PmfData::initialize(&PeleLM::pmf_data);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_60);
  return;
}

Assistant:

void amrex_probinit (const int* /*init*/,
                         const int* /*name*/,
                         const int* /*namelen*/,
                         const amrex_real* /*problo*/,
                         const amrex_real* /*probhi*/)
    {
        amrex::ParmParse pp("prob");

        pp.query("P_mean",   PeleLM::prob_parm->P_mean);
        pp.query("standoff", PeleLM::prob_parm->standoff);
        pp.query("pertmag",  PeleLM::prob_parm->pertmag);

        PeleLM::pmf_data.initialize();
    }